

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initManifestTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  ProString tmplt;
  QArrayData *local_a8;
  QArrayData *local_a0;
  ProKey local_98;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_98,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_68,&pQVar1->super_QMakeEvaluator,&local_98);
  if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar2 = ProString::operator==((ProString *)local_68,"vclib");
  if (bVar2) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar5.m_data = (storage_type *)0x12;
    QVar5.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar5);
    local_a8 = &(local_98.super_ProString.m_string.d.d)->super_QArrayData;
    config.m_data = local_98.super_ProString.m_string.d.ptr;
    config.m_size = local_98.super_ProString.m_string.d.size;
    bVar3 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if (bVar3) goto LAB_002488fe;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar7.m_data = (storage_type *)0x6;
    QVar7.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar7);
    local_a0 = &(local_98.super_ProString.m_string.d.d)->super_QArrayData;
    config_01.m_data = local_98.super_ProString.m_string.d.ptr;
    config_01.m_size = local_98.super_ProString.m_string.d.size;
    bVar3 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false);
    bVar4 = true;
    if (bVar3) {
      bVar4 = ProString::operator==((ProString *)local_68,"vcapp");
      bVar3 = true;
      if (!bVar4) {
        bVar4 = false;
        goto LAB_002489eb;
      }
      goto LAB_00248916;
    }
LAB_002489eb:
    bVar2 = true;
  }
  else {
LAB_002488fe:
    bVar4 = ProString::operator==((ProString *)local_68,"vcapp");
    bVar3 = false;
    if (!bVar4) {
      bVar4 = false;
      goto LAB_00248a10;
    }
LAB_00248916:
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar6.m_data = (storage_type *)0x12;
    QVar6.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar6);
    config_00.m_data = local_98.super_ProString.m_string.d.ptr;
    config_00.m_size = local_98.super_ProString.m_string.d.size;
    bVar4 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
    bVar4 = !bVar4;
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar3) goto LAB_00248a10;
  }
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0,2,0x10);
    }
  }
LAB_00248a10:
  if ((bVar2 != false) && (local_a8 != (QArrayData *)0x0)) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
  if (bVar4) {
    (this->vcProject).Configuration.manifestTool.EmbedManifest = _False;
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initManifestTool()
{
    VCManifestTool &tool = vcProject.Configuration.manifestTool;
    const ProString tmplt = project->first("TEMPLATE");
    if ((tmplt == "vclib"
         && !project->isActiveConfig("embed_manifest_dll")
         && !project->isActiveConfig("static"))
        || (tmplt == "vcapp"
            && !project->isActiveConfig("embed_manifest_exe"))) {
        tool.EmbedManifest = _False;
    }
}